

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_maxelements(lysp_yang_ctx *ctx,uint32_t *max,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  ushort **ppuVar2;
  int *piVar3;
  char *pcVar4;
  ly_ctx *local_a0;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  bool local_65;
  ly_stmt local_64;
  ly_bool __loop_end;
  ulonglong uStack_60;
  ly_stmt kw;
  unsigned_long_long num;
  size_t word_len;
  char *ptr;
  char *word;
  char *buf;
  lysp_ext_instance **pplStack_30;
  LY_ERR ret;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  uint32_t *max_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  word = (char *)0x0;
  pplStack_30 = exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)max;
  max_local = &ctx->format;
  if ((*flags & 0x400) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","max-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x400;
  buf._4_4_ = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&ptr,&word,&num);
  if (buf._4_4_ == LY_SUCCESS) {
    if (((num == 0) || (*ptr == '0')) ||
       ((*ptr != 'u' && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*ptr] & 0x800) == 0)))) {
      if (max_local == (uint32_t *)0x0) {
        local_78 = (ly_ctx *)0x0;
      }
      else {
        local_78 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)(max_local + 0xe) + 8) +
                      (ulong)(*(int *)(*(long *)(max_local + 0xe) + 4) - 1) * 8);
      }
      ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              num & 0xffffffff,ptr,"max-elements");
      buf._4_4_ = LY_EVALID;
    }
    else {
      iVar1 = ly_strncmp("unbounded",ptr,num);
      if (iVar1 == 0) {
        flags_local[0] = 0;
        flags_local[1] = 0;
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0;
        uStack_60 = strtoull(ptr,(char **)&word_len,10);
        if (word_len - (long)ptr != num) {
          if (max_local == (uint32_t *)0x0) {
            local_80 = (ly_ctx *)0x0;
          }
          else {
            local_80 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(*(long *)(max_local + 0xe) + 8) +
                          (ulong)(*(int *)(*(long *)(max_local + 0xe) + 4) - 1) * 8);
          }
          ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  num & 0xffffffff,ptr,"max-elements");
          buf._4_4_ = LY_EVALID;
          goto LAB_001c0c05;
        }
        piVar3 = __errno_location();
        if ((*piVar3 == 0x22) || (0xffffffff < uStack_60)) {
          if (max_local == (uint32_t *)0x0) {
            local_88 = (ly_ctx *)0x0;
          }
          else {
            local_88 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(*(long *)(max_local + 0xe) + 8) +
                          (ulong)(*(int *)(*(long *)(max_local + 0xe) + 4) - 1) * 8);
          }
          ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                  num & 0xffffffff,ptr,"max-elements");
          buf._4_4_ = LY_EVALID;
          goto LAB_001c0c05;
        }
        *(int *)flags_local = (int)uStack_60;
      }
      buf._4_4_ = get_keyword((lysp_yang_ctx *)max_local,&local_64,&ptr,&num);
      if (buf._4_4_ == LY_SUCCESS) {
        if (local_64 == LY_STMT_SYNTAX_SEMICOLON) {
          local_65 = true;
        }
        else {
          if (local_64 != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (max_local == (uint32_t *)0x0) {
              local_90 = (ly_ctx *)0x0;
            }
            else {
              local_90 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(*(long *)(max_local + 0xe) + 8) +
                            (ulong)(*(int *)(*(long *)(max_local + 0xe) + 4) - 1) * 8);
            }
            pcVar4 = lyplg_ext_stmt2str(local_64);
            ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
            buf._4_4_ = LY_EVALID;
            goto LAB_001c0c05;
          }
          buf._4_4_ = get_keyword((lysp_yang_ctx *)max_local,&local_64,&ptr,&num);
          if (buf._4_4_ != LY_SUCCESS) goto LAB_001c0c05;
          local_65 = local_64 == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        while (!local_65) {
          if (local_64 != LY_STMT_EXTENSION_INSTANCE) {
            if (max_local == (uint32_t *)0x0) {
              local_a0 = (ly_ctx *)0x0;
            }
            else {
              local_a0 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(*(long *)(max_local + 0xe) + 8) +
                            (ulong)(*(int *)(*(long *)(max_local + 0xe) + 4) - 1) * 8);
            }
            pcVar4 = lyplg_ext_stmt2str(local_64);
            ly_vlog(local_a0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"max-elements");
            buf._4_4_ = LY_EVALID;
            break;
          }
          buf._4_4_ = parse_ext((lysp_yang_ctx *)max_local,ptr,num,flags_local,LY_STMT_MAX_ELEMENTS,
                                0,pplStack_30);
          if ((buf._4_4_ != LY_SUCCESS) ||
             (buf._4_4_ = get_keyword((lysp_yang_ctx *)max_local,&local_64,&ptr,&num),
             buf._4_4_ != LY_SUCCESS)) break;
          if (local_64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
            local_65 = true;
          }
        }
      }
    }
  }
LAB_001c0c05:
  free(word);
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_maxelements(struct lysp_yang_ctx *ctx, uint32_t *max, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (*flags & LYS_SET_MAX) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "max-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MAX;

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || (word[0] == '0') || ((word[0] != 'u') && !isdigit(word[0]))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "max-elements");
        ret = LY_EVALID;
        goto cleanup;
    }

    if (ly_strncmp("unbounded", word, word_len)) {
        errno = 0;
        num = strtoull(word, &ptr, LY_BASE_DEC);
        /* we have not parsed the whole argument */
        if ((size_t)(ptr - word) != word_len) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "max-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        if ((errno == ERANGE) || (num > UINT32_MAX)) {
            LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "max-elements");
            ret = LY_EVALID;
            goto cleanup;
        }

        *max = num;
    } else {
        /* unbounded */
        *max = 0;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, max, LY_STMT_MAX_ELEMENTS, 0, exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "max-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}